

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * __thiscall
pbrt::detail::DispatchSplitCPU<3>::operator()
          (void *param_1,undefined8 param_2,
          TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          *param_3,int param_4)

{
  int mid;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  local_48;
  undefined1 local_3a [2];
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  local_38;
  undefined1 local_29;
  undefined4 local_28;
  int local_24;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  *local_20;
  undefined8 local_18;
  void *local_8;
  
  local_28 = 1;
  local_24 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  if (param_4 + -1 < 1) {
    TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    ::TaggedPointer(&local_38,param_3);
    DispatchSplitCPU<1>::operator()((DispatchSplitCPU<1> *)param_1,&local_29,&local_38,local_24);
  }
  else {
    TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    ::TaggedPointer(&local_48,param_3);
    DispatchSplitCPU<2>::operator()((DispatchSplitCPU<2> *)param_1,local_3a,&local_48,local_24 + -1)
    ;
  }
  return (string *)param_1;
}

Assistant:

inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplitCPU<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplitCPU<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }